

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void Ppmd8_Update1(CPpmd8 *p)

{
  CPpmd_State *t1;
  CPpmd_State *s;
  CPpmd8 *p_local;
  
  t1 = p->FoundState;
  t1->Freq = t1->Freq + '\x04';
  p->MinContext->SummFreq = p->MinContext->SummFreq + 4;
  if (t1[-1].Freq < t1->Freq) {
    SwapStates(t1,t1 + -1);
    p->FoundState = t1 + -1;
    if (0x7c < t1[-1].Freq) {
      Rescale(p);
    }
  }
  NextContext(p);
  return;
}

Assistant:

void Ppmd8_Update1(CPpmd8 *p)
{
  CPpmd_State *s = p->FoundState;
  s->Freq += 4;
  p->MinContext->SummFreq += 4;
  if (s[0].Freq > s[-1].Freq)
  {
    SwapStates(&s[0], &s[-1]);
    p->FoundState = --s;
    if (s->Freq > MAX_FREQ)
      Rescale(p);
  }
  NextContext(p);
}